

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O3

void BZ2_blockSort(EState *s)

{
  int *piVar1;
  byte bVar2;
  UInt32 UVar3;
  undefined4 uVar4;
  UInt32 *pUVar5;
  byte *block;
  char cVar6;
  Bool BVar7;
  int iVar8;
  Int32 *pIVar9;
  uint *puVar10;
  byte bVar11;
  UInt32 UVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  UInt32 *pUVar17;
  ulong uVar18;
  byte bVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  byte bVar24;
  UInt16 UVar25;
  uint in_R8D;
  byte *pbVar26;
  Int32 zztmp_1;
  ushort uVar27;
  int iVar28;
  uint uVar29;
  UInt32 *pUVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  Int32 zztmp;
  long lVar34;
  int iVar35;
  bool bVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  Int32 budget;
  Bool bigDone [256];
  Int32 stackHi [100];
  Int32 stackLo [100];
  Int32 runningOrder [256];
  Int32 copyStart [256];
  int local_12bc;
  int local_129c;
  long local_1298;
  ulong local_1290;
  ulong local_1288;
  UInt16 *local_1280;
  int local_1274;
  int local_1270;
  int local_126c;
  UInt32 *local_1268;
  ulong local_1260;
  EState *local_1258;
  ulong local_1250;
  long local_1248;
  long local_1240;
  int local_1234;
  int local_1230;
  int local_122c;
  UInt32 *local_1228;
  UInt32 *local_1220;
  UInt32 *local_1218;
  long local_1210;
  ulong local_1208;
  ulong local_1200;
  ulong local_11f8;
  ulong local_11f0;
  char local_11e8 [256];
  int local_10e8 [100];
  uint local_f58 [100];
  uint local_dc8 [100];
  uint auStack_c38 [512];
  uint auStack_438 [258];
  
  pUVar30 = s->ftab;
  pUVar5 = s->ptr;
  uVar37 = s->nblock;
  lVar34 = (long)(int)uVar37;
  if (9999 < lVar34) {
    block = s->block;
    uVar18 = (ulong)((uVar37 & 1) + uVar37);
    local_1280 = (UInt16 *)(block + uVar18 + 0x22);
    iVar14 = 1;
    if (1 < s->workFactor) {
      iVar14 = s->workFactor;
    }
    cVar6 = 'd';
    if (iVar14 < 100) {
      cVar6 = (char)iVar14;
    }
    local_12bc = ((byte)(cVar6 - 1) / 3) * uVar37;
    local_129c = local_12bc;
    local_1258 = s;
    memset(pUVar30,0,0x40004);
    bVar11 = *block;
    local_1260 = (ulong)(uVar37 - 1);
    lVar20 = uVar18 + local_1260 * 2;
    uVar15 = 0;
    do {
      (block + uVar15 * 2 + lVar20 + 0x22)[0] = 0;
      (block + uVar15 * 2 + lVar20 + 0x22)[1] = 0;
      bVar24 = block[uVar15 + local_1260];
      pUVar30[CONCAT11(bVar24,bVar11)] = pUVar30[CONCAT11(bVar24,bVar11)] + 1;
      (block + uVar15 * 2 + lVar20 + 0x20)[0] = 0;
      (block + uVar15 * 2 + lVar20 + 0x20)[1] = 0;
      bVar11 = block[uVar15 + (local_1260 - 1)];
      piVar1 = (int *)((long)pUVar30 + (ulong)((uint)bVar11 * 0x400 + (uint)bVar24 * 4));
      *piVar1 = *piVar1 + 1;
      (block + uVar15 * 2 + lVar20 + 0x1e)[0] = 0;
      (block + uVar15 * 2 + lVar20 + 0x1e)[1] = 0;
      bVar24 = block[uVar15 + (local_1260 - 2)];
      piVar1 = (int *)((long)pUVar30 + (ulong)((uint)bVar24 * 0x400 + (uint)bVar11 * 4));
      *piVar1 = *piVar1 + 1;
      (block + uVar15 * 2 + lVar20 + 0x1c)[0] = 0;
      (block + uVar15 * 2 + lVar20 + 0x1c)[1] = 0;
      bVar11 = block[uVar15 + (local_1260 - 3)];
      uVar23 = (ulong)CONCAT11(bVar11,bVar24);
      pUVar30[uVar23] = pUVar30[uVar23] + 1;
      uVar16 = local_1260 + uVar15;
      uVar15 = uVar15 - 4;
    } while (6 < uVar16);
    if (3 < local_1260 + uVar15 + 4) {
      do {
        (block + uVar15 * 2 + uVar18 + 0x22 + local_1260 * 2)[0] = 0;
        (block + uVar15 * 2 + uVar18 + 0x22 + local_1260 * 2)[1] = 0;
        uVar23 = (ulong)((uint)block[uVar15 + local_1260] << 8 | (uint)(uVar23 >> 8));
        pUVar30[uVar23] = pUVar30[uVar23] + 1;
        uVar15 = uVar15 - 1;
      } while (~local_1260 != uVar15);
    }
    lVar20 = 0;
    do {
      block[lVar20 + lVar34] = block[lVar20];
      (block + lVar20 * 2 + uVar18 + 0x22 + lVar34 * 2)[0] = 0;
      (block + lVar20 * 2 + uVar18 + 0x22 + lVar34 * 2)[1] = 0;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x22);
    UVar12 = *pUVar30;
    lVar20 = 0;
    do {
      UVar12 = UVar12 + pUVar30[lVar20 + 1];
      pUVar30[lVar20 + 1] = UVar12;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x10000);
    uVar15 = (ulong)*block << 8;
    lVar20 = 0;
    uVar18 = local_1260;
    do {
      bVar11 = block[lVar20 + local_1260];
      uVar27 = (ushort)bVar11 << 8 | (ushort)uVar15 >> 8;
      UVar12 = pUVar30[uVar27];
      pUVar30[uVar27] = UVar12 - 1;
      pUVar5[(int)(UVar12 - 1)] = (UInt32)uVar18;
      bVar24 = block[lVar20 + (local_1260 - 1)];
      uVar27 = CONCAT11(bVar24,bVar11);
      UVar12 = pUVar30[uVar27];
      pUVar30[uVar27] = UVar12 - 1;
      iVar14 = (int)lVar20;
      pUVar5[(int)(UVar12 - 1)] = (uVar37 - 2) + iVar14;
      bVar11 = block[lVar20 + (local_1260 - 2)];
      uVar27 = CONCAT11(bVar11,bVar24);
      UVar12 = pUVar30[uVar27];
      pUVar30[uVar27] = UVar12 - 1;
      pUVar5[(int)(UVar12 - 1)] = (uVar37 - 3) + iVar14;
      uVar27 = CONCAT11(block[lVar20 + (local_1260 - 3)],bVar11);
      uVar15 = (ulong)uVar27;
      UVar12 = pUVar30[uVar27];
      pUVar30[uVar27] = UVar12 - 1;
      pUVar5[(int)(UVar12 - 1)] = (uVar37 - 4) + iVar14;
      uVar18 = (ulong)((UInt32)uVar18 - 4);
      uVar16 = local_1260 + lVar20;
      lVar20 = lVar20 + -4;
    } while (6 < uVar16);
    if (3 < local_1260 + lVar20 + 4) {
      lVar20 = lVar20 + local_1260;
      do {
        uVar15 = (ulong)(ushort)((ushort)uVar15 >> 8 | (ushort)block[lVar20] << 8);
        UVar12 = pUVar30[uVar15];
        pUVar30[uVar15] = UVar12 - 1;
        pUVar5[(int)(UVar12 - 1)] = (UInt32)uVar18;
        uVar18 = (ulong)((UInt32)uVar18 - 1);
        bVar36 = lVar20 != 0;
        lVar20 = lVar20 + -1;
      } while (bVar36);
    }
    lVar20 = 0;
    local_1298 = lVar34;
    memset(local_11e8,0,0x100);
    uVar37 = 0;
    uVar38 = 1;
    uVar39 = 2;
    uVar40 = 3;
    do {
      auStack_c38[lVar20] = uVar37;
      auStack_c38[lVar20 + 1] = uVar38;
      auStack_c38[lVar20 + 2] = uVar39;
      auStack_c38[lVar20 + 3] = uVar40;
      lVar20 = lVar20 + 4;
      uVar37 = uVar37 + 4;
      uVar38 = uVar38 + 4;
      uVar39 = uVar39 + 4;
      uVar40 = uVar40 + 4;
    } while (lVar20 != 0x100);
    iVar14 = 0x16c;
    do {
      iVar13 = iVar14 / 3;
      if (iVar14 < 0x300) {
        uVar18 = (ulong)iVar13;
        iVar8 = 0xff;
        if (0xff < iVar13) {
          iVar8 = iVar13;
        }
        iVar21 = 0;
        do {
          uVar37 = auStack_c38[uVar18];
          iVar28 = uVar37 * 0x100;
          UVar12 = pUVar30[iVar28 + 0x100];
          UVar3 = pUVar30[iVar28];
          iVar28 = iVar21;
          do {
            iVar35 = auStack_c38[iVar28] * 0x100;
            lVar34 = (long)(iVar13 + iVar28);
            if (pUVar30[iVar35 + 0x100] - pUVar30[iVar35] <= UVar12 - UVar3) break;
            auStack_c38[iVar13 + iVar28] = auStack_c38[iVar28];
            bVar36 = iVar13 <= iVar28;
            lVar34 = (long)iVar28;
            iVar28 = iVar28 - iVar13;
          } while (bVar36);
          auStack_c38[lVar34] = uVar37;
          uVar18 = uVar18 + 1;
          iVar21 = iVar21 + 1;
        } while (uVar18 != iVar8 + 1);
      }
      uVar37 = iVar14 - 3;
      iVar14 = iVar13;
    } while (2 < uVar37);
    local_1218 = pUVar30 + 1;
    local_1220 = pUVar5 + -1;
    lVar34 = 0;
    local_1228 = pUVar30;
    do {
      uVar18 = (ulong)auStack_c38[lVar34];
      local_1234 = auStack_c38[lVar34] << 8;
      pUVar17 = pUVar30 + local_1234;
      uVar15 = 0;
      local_1268 = pUVar17;
      local_1208 = uVar18;
      do {
        if (uVar15 != uVar18) {
          uVar37 = pUVar17[uVar15];
          if (((uVar37 >> 0x15 & 1) == 0) &&
             (uVar38 = (pUVar17[uVar15 + 1] & 0xffdfffff) - 1, pUVar17 = local_1268,
             (int)uVar37 < (int)uVar38)) {
            local_dc8[0] = uVar37;
            local_f58[0] = uVar38;
            local_10e8[0] = 2;
            uVar37 = 1;
            local_1210 = lVar34;
            local_1200 = uVar15;
            do {
              local_1288 = (ulong)(uVar37 - 1);
LAB_0010e3c4:
              if (0x61 < uVar37) {
                bz_internal_error(0x3e9);
              }
              uVar38 = local_dc8[local_1288];
              local_1250 = (ulong)uVar38;
              uVar39 = local_f58[local_1288];
              lVar34 = (long)(int)uVar39;
              iVar14 = local_10e8[local_1288];
              iVar13 = uVar39 - uVar38;
              if ((iVar13 < 0x14) || (0xe < iVar14)) {
                if (0 < iVar13) {
                  uVar18 = 0xffffffffffffffff;
                  pIVar9 = incs;
                  do {
                    uVar18 = uVar18 + 1;
                    iVar8 = *pIVar9;
                    pIVar9 = pIVar9 + 1;
                  } while (iVar8 <= iVar13);
                  if (uVar18 != 0) {
                    local_122c = uVar38 + 1;
                    local_1230 = uVar38 + 2;
                    local_11f0 = uVar18;
                    local_1248 = lVar34;
                    do {
                      iVar13 = incs[local_11f0 - 1 & 0xffffffff];
                      local_126c = (int)local_1250;
                      iVar8 = iVar13 + local_126c;
                      lVar20 = (long)iVar8;
                      local_1274 = local_1230;
                      local_1270 = local_122c;
                      local_11f8 = local_11f0;
                      local_11f0 = local_11f0 - 1;
                      while (lVar20 <= lVar34) {
                        uVar37 = pUVar5[lVar20];
                        local_1290 = (ulong)uVar37;
                        iVar21 = local_126c;
                        local_1240 = lVar20;
                        do {
                          UVar12 = pUVar5[iVar21];
                          BVar7 = mainGtU(UVar12 + iVar14,uVar37 + iVar14,block,local_1280,
                                          (UInt32)local_1298,&local_129c);
                          lVar34 = (long)(iVar13 + iVar21);
                          if (BVar7 == '\0') break;
                          pUVar5[iVar13 + iVar21] = UVar12;
                          bVar36 = iVar8 <= iVar21;
                          lVar34 = (long)iVar21;
                          iVar21 = iVar21 - iVar13;
                        } while (bVar36);
                        pUVar5[lVar34] = (UInt32)local_1290;
                        lVar34 = local_1248;
                        if (local_1248 <= local_1240) break;
                        uVar37 = pUVar5[local_1240 + 1];
                        local_1290 = (ulong)uVar37;
                        iVar21 = local_1270;
                        do {
                          UVar12 = pUVar5[iVar21];
                          BVar7 = mainGtU(UVar12 + iVar14,uVar37 + iVar14,block,local_1280,
                                          (UInt32)local_1298,&local_129c);
                          lVar34 = (long)(iVar13 + iVar21);
                          if (BVar7 == '\0') break;
                          pUVar5[iVar13 + iVar21] = UVar12;
                          bVar36 = iVar8 <= iVar21;
                          lVar34 = (long)iVar21;
                          iVar21 = iVar21 - iVar13;
                        } while (bVar36);
                        pUVar5[lVar34] = (UInt32)local_1290;
                        lVar34 = local_1248;
                        if (local_1248 < local_1240 + 2) break;
                        uVar37 = pUVar5[local_1240 + 2];
                        local_1290 = (ulong)uVar37;
                        iVar21 = local_1274;
                        do {
                          UVar12 = pUVar5[iVar21];
                          BVar7 = mainGtU(UVar12 + iVar14,uVar37 + iVar14,block,local_1280,
                                          (UInt32)local_1298,&local_129c);
                          lVar34 = (long)(iVar13 + iVar21);
                          if (BVar7 == '\0') break;
                          pUVar5[iVar13 + iVar21] = UVar12;
                          bVar36 = iVar8 <= iVar21;
                          lVar34 = (long)iVar21;
                          iVar21 = iVar21 - iVar13;
                        } while (bVar36);
                        pUVar5[lVar34] = (UInt32)local_1290;
                        lVar20 = local_1240 + 3;
                        local_126c = local_126c + 3;
                        local_1270 = local_1270 + 3;
                        local_1274 = local_1274 + 3;
                        lVar34 = local_1248;
                        local_12bc = local_129c;
                        if (local_129c < 0) goto LAB_0010ec59;
                      }
                    } while (1 < (long)local_11f8);
                    local_12bc = local_129c;
                  }
                }
                in_R8D = (uint)lVar34;
                if (-1 < local_12bc) goto LAB_0010e9cf;
LAB_0010ec59:
                in_R8D = (uint)lVar34;
                pUVar30 = local_1228;
                goto LAB_0010ec66;
              }
              lVar20 = (long)(int)uVar38;
              bVar11 = block[pUVar5[lVar20] + iVar14];
              bVar24 = block[pUVar5[lVar34] + iVar14];
              bVar19 = bVar24;
              if (bVar11 >= bVar24 && bVar11 != bVar24) {
                bVar19 = bVar11;
              }
              bVar2 = block[pUVar5[(int)(uVar39 + uVar38) >> 1] + iVar14];
              if (bVar11 < bVar24) {
                bVar24 = bVar11;
              }
              if (bVar24 <= bVar2) {
                bVar24 = bVar2;
              }
              if (bVar19 <= bVar2) {
                bVar24 = bVar19;
              }
              uVar16 = (ulong)uVar39;
              uVar18 = local_1250;
              uVar15 = local_1250;
              uVar40 = uVar39;
LAB_0010e464:
              uVar29 = (uint)uVar15;
              if ((int)uVar29 <= (int)uVar40) {
                uVar18 = (ulong)(int)uVar18;
                do {
                  uVar31 = (uint)uVar15;
                  lVar34 = (long)(int)uVar31 + -1;
                  while( true ) {
                    UVar12 = pUVar5[lVar34 + 1];
                    bVar11 = block[iVar14 + UVar12];
                    uVar29 = (uint)uVar15;
                    if (bVar11 == bVar24) break;
                    if (bVar24 <= bVar11 && bVar11 != bVar24) goto LAB_0010e4c5;
                    uVar15 = (ulong)(uVar29 + 1);
                    lVar34 = lVar34 + 1;
                    if ((int)uVar40 <= lVar34) {
                      if ((int)uVar31 <= (int)uVar40) {
                        uVar31 = uVar40;
                      }
                      uVar29 = uVar31 + 1;
                      goto LAB_0010e4c5;
                    }
                  }
                  pUVar5[lVar34 + 1] = pUVar5[uVar18];
                  pUVar5[uVar18] = UVar12;
                  uVar18 = uVar18 + 1;
                  uVar15 = (ulong)(uVar29 + 1);
                } while ((int)uVar29 < (int)uVar40);
                uVar29 = uVar29 + 1;
              }
LAB_0010e4c5:
              if ((int)uVar29 <= (int)uVar40) {
                lVar34 = (long)(int)uVar29;
                uVar16 = (ulong)(int)uVar16;
                do {
                  lVar33 = (long)(int)uVar40 + 1;
                  uVar31 = uVar40;
                  while( true ) {
                    UVar12 = pUVar5[lVar33 + -1];
                    if (block[iVar14 + UVar12] == bVar24) break;
                    if (block[iVar14 + UVar12] < bVar24) {
                      UVar3 = pUVar5[lVar34];
                      pUVar5[lVar34] = UVar12;
                      pUVar5[lVar33 + -1] = UVar3;
                      uVar40 = uVar31 - 1;
                      uVar15 = (ulong)(uVar29 + 1);
                      goto LAB_0010e464;
                    }
                    lVar33 = lVar33 + -1;
                    uVar31 = uVar31 - 1;
                    if (lVar33 <= lVar34) {
                      uVar31 = uVar29;
                      if ((int)uVar40 < lVar34) {
                        uVar31 = uVar40;
                      }
                      uVar40 = uVar31 - 1;
                      goto LAB_0010e573;
                    }
                  }
                  pUVar5[lVar33 + -1] = pUVar5[uVar16];
                  pUVar5[uVar16] = UVar12;
                  uVar16 = uVar16 - 1;
                  uVar40 = uVar31 - 1;
                } while ((int)uVar29 < (int)uVar31);
                uVar40 = uVar31 - 1;
              }
LAB_0010e573:
              iVar13 = (int)uVar16;
              iVar8 = (int)uVar18;
              if (iVar13 < iVar8) goto code_r0x0010e57b;
              iVar21 = uVar29 - iVar8;
              if ((int)(iVar8 - uVar38) < (int)(uVar29 - iVar8)) {
                iVar21 = iVar8 - uVar38;
              }
              if (0 < iVar21) {
                uVar31 = iVar21 + 1;
                lVar34 = 0;
                do {
                  uVar4 = *(undefined4 *)((long)pUVar5 + lVar34 + lVar20 * 4);
                  *(undefined4 *)((long)pUVar5 + lVar34 + lVar20 * 4) =
                       *(undefined4 *)((long)pUVar5 + lVar34 + (long)(int)(uVar29 - iVar21) * 4);
                  *(undefined4 *)((long)pUVar5 + lVar34 + (long)(int)(uVar29 - iVar21) * 4) = uVar4;
                  lVar34 = lVar34 + 4;
                  uVar31 = uVar31 - 1;
                } while (1 < uVar31);
              }
              iVar28 = iVar13 - uVar40;
              iVar21 = uVar39 - iVar13;
              if (iVar28 <= (int)(uVar39 - iVar13)) {
                iVar21 = iVar28;
              }
              if (0 < iVar21) {
                uVar40 = iVar21 + 1;
                pUVar30 = pUVar5;
                do {
                  UVar12 = pUVar30[(int)uVar29];
                  pUVar30[(int)uVar29] = pUVar30[(long)(int)(uVar39 - iVar21) + 1];
                  pUVar30[(long)(int)(uVar39 - iVar21) + 1] = UVar12;
                  pUVar30 = pUVar30 + 1;
                  uVar40 = uVar40 - 1;
                } while (1 < uVar40);
              }
              uVar32 = ((uVar38 - iVar8) + uVar29) - 1;
              in_R8D = uVar39 - iVar28;
              uVar40 = in_R8D + 1;
              iVar13 = uVar39 - uVar40;
              uVar31 = uVar39;
              uVar22 = uVar38;
              if ((int)(uVar32 - uVar38) < iVar13) {
                iVar13 = uVar32 - uVar38;
                uVar31 = uVar32;
                uVar32 = uVar39;
                uVar22 = uVar40;
                uVar40 = uVar38;
              }
              uVar29 = (uVar38 - iVar8) + uVar29;
              uVar38 = uVar31;
              uVar39 = uVar40;
              iVar21 = iVar14 + 1;
              iVar8 = iVar14;
              if (iVar13 < (int)(in_R8D - uVar29)) {
                uVar38 = in_R8D;
                iVar13 = in_R8D - uVar29;
                uVar39 = uVar29;
                uVar29 = uVar40;
                iVar21 = iVar14;
                in_R8D = uVar31;
                iVar8 = iVar14 + 1;
              }
              uVar40 = uVar32;
              uVar31 = uVar22;
              iVar28 = iVar14;
              if ((int)(uVar32 - uVar22) < iVar13) {
                uVar40 = uVar38;
                uVar31 = uVar39;
                iVar28 = iVar8;
                uVar39 = uVar22;
                uVar38 = uVar32;
                iVar8 = iVar14;
              }
              local_dc8[local_1288] = uVar31;
              local_f58[local_1288] = uVar40;
              local_10e8[local_1288] = iVar28;
              local_dc8[uVar37] = uVar39;
              local_f58[uVar37] = uVar38;
              local_10e8[uVar37] = iVar8;
              local_dc8[(ulong)uVar37 + 1] = uVar29;
              local_f58[(ulong)uVar37 + 1] = in_R8D;
              local_10e8[(ulong)uVar37 + 1] = iVar21;
              local_1288 = (ulong)(uVar37 + 2);
LAB_0010e9cf:
              uVar37 = (uint)local_1288;
            } while (0 < (int)uVar37);
            pUVar30 = local_1228;
            if (local_12bc < 0) {
              uVar37 = (uint)local_1298;
              s = local_1258;
              goto LAB_0010ec6f;
            }
            uVar37 = local_1268[local_1200];
            pUVar17 = local_1268;
            uVar15 = local_1200;
            lVar34 = local_1210;
          }
          pUVar17[uVar15] = uVar37 | 0x200000;
          uVar18 = local_1208;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != 0x100);
      lVar20 = (long)(int)uVar18;
      if (local_11e8[lVar20] != '\0') {
        bz_internal_error(0x3ee);
      }
      puVar10 = local_1218 + lVar20;
      lVar33 = 0;
      do {
        auStack_438[lVar33] = puVar10[-1] & 0xffdfffff;
        auStack_c38[lVar33 + 0x100] = (*puVar10 & 0xffdfffff) - 1;
        lVar33 = lVar33 + 1;
        puVar10 = puVar10 + 0x100;
      } while (lVar33 != 0x100);
      in_R8D = 0xffdfffff;
      uVar18 = (long)(int)*local_1268 & 0xffffffffffdfffff;
      uVar37 = auStack_438[lVar20];
      if ((int)uVar18 < (int)uVar37) {
        do {
          UVar12 = (pUVar5[uVar18] + ((int)(pUVar5[uVar18] - 1) >> 0x1f & (uint)local_1298)) - 1;
          bVar11 = block[(int)UVar12];
          if (local_11e8[bVar11] == '\0') {
            uVar37 = auStack_438[bVar11];
            auStack_438[bVar11] = uVar37 + 1;
            pUVar5[(int)uVar37] = UVar12;
            uVar37 = auStack_438[lVar20];
          }
          uVar18 = uVar18 + 1;
        } while ((long)uVar18 < (long)(int)uVar37);
      }
      iVar14 = local_1234 + 0x100;
      iVar13 = (pUVar30[iVar14] & 0xffdfffff) - 1;
      uVar38 = auStack_c38[lVar20 + 0x100];
      if ((int)uVar38 < iVar13) {
        lVar33 = (long)iVar13;
        do {
          UVar12 = (pUVar5[lVar33] + ((int)(pUVar5[lVar33] - 1) >> 0x1f & (uint)local_1298)) - 1;
          uVar18 = (ulong)block[(int)UVar12];
          pbVar26 = block;
          if (local_11e8[uVar18] == '\0') {
            uVar38 = auStack_c38[uVar18 + 0x100];
            uVar39 = uVar38 - 1;
            pbVar26 = (byte *)(ulong)uVar39;
            auStack_c38[uVar18 + 0x100] = uVar39;
            pUVar5[(int)uVar38] = UVar12;
            uVar38 = auStack_c38[lVar20 + 0x100];
          }
          in_R8D = (uint)pbVar26;
          lVar33 = lVar33 + -1;
        } while ((int)uVar38 < lVar33);
      }
      if ((uVar37 - 1 != uVar38) && ((uVar37 != 0 || (uVar38 != (uint)local_1260)))) {
        bz_internal_error(0x3ef);
      }
      lVar33 = 0;
      do {
        pbVar26 = (byte *)((long)pUVar30 + lVar33 + lVar20 * 4 + 2);
        *pbVar26 = *pbVar26 | 0x20;
        lVar33 = lVar33 + 0x400;
      } while (lVar33 != 0x40000);
      local_11e8[lVar20] = '\x01';
      if (lVar34 == 0xff) goto LAB_0010ec66;
      UVar12 = *local_1268;
      uVar37 = (pUVar30[iVar14] & 0xffdfffff) - (int)((long)(int)UVar12 & 0xffffffffffdfffffU);
      bVar11 = 0xff;
      do {
        bVar11 = bVar11 + 1;
      } while (0xfffe < (int)uVar37 >> (bVar11 & 0x1f));
      if (0 < (int)uVar37) {
        uVar18 = (ulong)uVar37;
        do {
          UVar3 = local_1220[((long)(int)UVar12 & 0xffffffffffdfffffU) + uVar18];
          UVar25 = (UInt16)((uint)(uVar18 - 1) >> (bVar11 & 0x1f));
          local_1280[(int)UVar3] = UVar25;
          if ((long)(int)UVar3 < 0x22) {
            local_1280[(int)(UVar3 + (int)local_1298)] = UVar25;
          }
          bVar36 = 1 < uVar18;
          uVar18 = uVar18 - 1;
        } while (bVar36);
      }
      if (0xffff < (int)(uVar37 - 1) >> (bVar11 & 0x1f)) {
        bz_internal_error(0x3ea);
      }
      lVar34 = lVar34 + 1;
    } while( true );
  }
LAB_0010ec6f:
  fallbackSort(s->arr1,s->arr2,pUVar30,uVar37,in_R8D);
LAB_0010ec82:
  s->origPtr = -1;
  if (0 < (long)s->nblock) {
    lVar34 = 0;
    do {
      if (pUVar5[lVar34] == 0) {
        s->origPtr = (Int32)lVar34;
        return;
      }
      lVar34 = lVar34 + 1;
    } while (s->nblock != lVar34);
  }
  bz_internal_error(0x3eb);
  return;
code_r0x0010e57b:
  local_10e8[local_1288] = iVar14 + 1;
  goto LAB_0010e3c4;
LAB_0010ec66:
  uVar37 = (uint)local_1298;
  s = local_1258;
  if (-1 < local_12bc) goto LAB_0010ec82;
  goto LAB_0010ec6f;
}

Assistant:

void BZ2_blockSort ( EState* s )
{
   UInt32* ptr    = s->ptr; 
   UChar*  block  = s->block;
   UInt32* ftab   = s->ftab;
   Int32   nblock = s->nblock;
   Int32   verb   = s->verbosity;
   Int32   wfact  = s->workFactor;
   UInt16* quadrant;
   Int32   budget;
   Int32   budgetInit;
   Int32   i;

   if (nblock < 10000) {
      fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
   } else {
      /* Calculate the location for quadrant, remembering to get
         the alignment right.  Assumes that &(block[0]) is at least
         2-byte aligned -- this should be ok since block is really
         the first section of arr2.
      */
      i = nblock+BZ_N_OVERSHOOT;
      if (i & 1) i++;
      quadrant = (UInt16*)(&(block[i]));

      /* (wfact-1) / 3 puts the default-factor-30
         transition point at very roughly the same place as 
         with v0.1 and v0.9.0.  
         Not that it particularly matters any more, since the
         resulting compressed stream is now the same regardless
         of whether or not we use the main sort or fallback sort.
      */
      if (wfact < 1  ) wfact = 1;
      if (wfact > 100) wfact = 100;
      budgetInit = nblock * ((wfact-1) / 3);
      budget = budgetInit;

      mainSort ( ptr, block, quadrant, ftab, nblock, verb, &budget );
      if (verb >= 3) 
         VPrintf3 ( "      %d work, %d block, ratio %5.2f\n",
                    budgetInit - budget,
                    nblock, 
                    (float)(budgetInit - budget) /
                    (float)(nblock==0 ? 1 : nblock) ); 
      if (budget < 0) {
         if (verb >= 2) 
            VPrintf0 ( "    too repetitive; using fallback"
                       " sorting algorithm\n" );
         fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
      }
   }

   s->origPtr = -1;
   for (i = 0; i < s->nblock; i++)
      if (ptr[i] == 0)
         { s->origPtr = i; break; };

   AssertH( s->origPtr != -1, 1003 );
}